

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O3

void DumpStateHelper(FStateLabels *StateList,FString *prefix)

{
  FStateLabel *pFVar1;
  FState *pFVar2;
  PClassActor *pPVar3;
  FState *pFVar4;
  FStateLabels *StateList_00;
  ulong uVar5;
  long lVar6;
  FString FStack_48;
  FStateLabel *local_40;
  FString local_38;
  
  if (0 < StateList->NumLabels) {
    local_40 = StateList->Labels;
    lVar6 = 0;
    do {
      pFVar1 = local_40 + lVar6;
      pFVar2 = pFVar1->State;
      if (pFVar2 != (FState *)0x0) {
        if ((ulong)PClassActor::AllActorClasses.Count != 0) {
          uVar5 = 0;
          do {
            pPVar3 = PClassActor::AllActorClasses.Array[uVar5];
            pFVar4 = pPVar3->OwnedStates;
            if ((pFVar4 <= pFVar2) && (pFVar2 < pFVar4 + pPVar3->NumOwnedStates)) {
              Printf(5,"%s%s: %s.%d\n",prefix->Chars,
                     FName::NameData.NameArray[(pFVar1->Label).Index].Text,
                     FName::NameData.NameArray
                     [(pPVar3->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text,
                     (ulong)(uint)((int)((ulong)((long)pFVar2 - (long)pFVar4) >> 3) * -0x33333333));
              goto LAB_00572a02;
            }
            uVar5 = uVar5 + 1;
          } while (PClassActor::AllActorClasses.Count != uVar5);
        }
        Printf(5,"%s%s: invalid\n",prefix->Chars,
               FName::NameData.NameArray[(pFVar1->Label).Index].Text);
      }
LAB_00572a02:
      StateList_00 = pFVar1->Children;
      if (StateList_00 != (FStateLabels *)0x0) {
        FString::operator+(&FStack_48,(char)prefix);
        FString::operator+(&local_38,(char *)&FStack_48);
        DumpStateHelper(StateList_00,&local_38);
        FString::~FString(&local_38);
        FString::~FString(&FStack_48);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < StateList->NumLabels);
  }
  return;
}

Assistant:

void DumpStateHelper(FStateLabels *StateList, const FString &prefix)
{
	for (int i = 0; i < StateList->NumLabels; i++)
	{
		if (StateList->Labels[i].State != NULL)
		{
			const PClassActor *owner = FState::StaticFindStateOwner(StateList->Labels[i].State);
			if (owner == NULL)
			{
				Printf(PRINT_LOG, "%s%s: invalid\n", prefix.GetChars(), StateList->Labels[i].Label.GetChars());
			}
			else
			{
				Printf(PRINT_LOG, "%s%s: %s.%d\n", prefix.GetChars(), StateList->Labels[i].Label.GetChars(),
					owner->TypeName.GetChars(), int(StateList->Labels[i].State - owner->OwnedStates));
			}
		}
		if (StateList->Labels[i].Children != NULL)
		{
			DumpStateHelper(StateList->Labels[i].Children, prefix + '.' + StateList->Labels[i].Label.GetChars());
		}
	}
}